

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall
wasm::
WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
::run(WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
      *this,Module *module)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> wasm;
  uint uVar1;
  PassRunner *pPVar2;
  PassOptions *pPVar3;
  int *piVar4;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_2a0;
  PassOptions local_298;
  undefined1 local_1f0 [8];
  PassRunner runner;
  int local_c4;
  undefined1 local_c0 [8];
  PassOptions options;
  Module *module_local;
  WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
  *this_local;
  
  options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)module;
  pPVar2 = Pass::getPassRunner(&this->super_Pass);
  if (pPVar2 != (PassRunner *)0x0) {
    uVar1 = (*(this->super_Pass)._vptr_Pass[4])();
    if ((uVar1 & 1) == 0) {
      Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
      ::walkModule(&(this->
                    super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                    ).
                    super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                   ,(Module *)
                    options.funcEffectsMap.
                    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
    }
    else {
      pPVar3 = Pass::getPassOptions(&this->super_Pass);
      PassOptions::PassOptions((PassOptions *)local_c0,pPVar3);
      local_c4 = 1;
      piVar4 = std::min<int>((int *)(local_c0 + 4),&local_c4);
      local_c0._4_4_ = *piVar4;
      runner.skippedPasses._M_h._M_single_bucket._0_4_ = 1;
      piVar4 = std::min<int>((int *)&options,(int *)&runner.skippedPasses._M_h._M_single_bucket);
      wasm = options.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
      options._0_4_ = *piVar4;
      PassOptions::PassOptions(&local_298,(PassOptions *)local_c0);
      PassRunner::PassRunner((PassRunner *)local_1f0,(Module *)wasm._M_pi,&local_298);
      PassOptions::~PassOptions(&local_298);
      PassRunner::setIsNested((PassRunner *)local_1f0,true);
      (*(this->super_Pass)._vptr_Pass[5])(&local_2a0);
      PassRunner::add((PassRunner *)local_1f0,&local_2a0);
      std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_2a0);
      PassRunner::run((PassRunner *)local_1f0);
      PassRunner::~PassRunner((PassRunner *)local_1f0);
      PassOptions::~PassOptions((PassOptions *)local_c0);
    }
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                ,500,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation>>::run(Module *) [WalkerType = wasm::PostWalker<wasm::ParallelFuncCastEmulation>]"
               );
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }